

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::EGLImage::EGLImage
          (EGLImage *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_28;
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  local_18.m_ptr = event->m_ptr;
  local_18.m_state = event->m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_28.m_ptr = sync->m_ptr;
  local_28.m_state = sync->m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::Object(&this->super_Object,"EGLImage",&local_18,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_28);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_18);
  (this->super_Object).super_Object._vptr_Object = (_func_int **)&PTR__Object_003d66f8;
  this->image = (EGLImageKHR)0x0;
  return;
}

Assistant:

EGLImage::EGLImage (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<FenceSync> sync)
	: Object	("EGLImage", event, sync)
	, image		(EGL_NO_IMAGE_KHR)
{
}